

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O3

Gia_Man_t * Gia_ManDupLastPis(Gia_Man_t *p,int nLastPis)

{
  uint uVar1;
  char *pcVar2;
  Gia_Obj_t *pGVar3;
  Gia_Obj_t *pGVar4;
  int iVar5;
  Gia_Man_t *p_00;
  size_t sVar6;
  char *pcVar7;
  Gia_Obj_t *pGVar8;
  Vec_Int_t *pVVar9;
  uint uVar10;
  ulong uVar11;
  long lVar12;
  long lVar13;
  
  if (p->nRegs != 0) {
    __assert_fail("Gia_ManRegNum(p) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaDup.c"
                  ,0x1f2,"Gia_Man_t *Gia_ManDupLastPis(Gia_Man_t *, int)");
  }
  p_00 = Gia_ManStart(p->nObjs);
  pcVar2 = p->pName;
  if (pcVar2 == (char *)0x0) {
    pcVar7 = (char *)0x0;
  }
  else {
    sVar6 = strlen(pcVar2);
    pcVar7 = (char *)malloc(sVar6 + 1);
    strcpy(pcVar7,pcVar2);
  }
  p_00->pName = pcVar7;
  pcVar2 = p->pSpec;
  if (pcVar2 == (char *)0x0) {
    pcVar7 = (char *)0x0;
  }
  else {
    sVar6 = strlen(pcVar2);
    pcVar7 = (char *)malloc(sVar6 + 1);
    strcpy(pcVar7,pcVar2);
  }
  p_00->pSpec = pcVar7;
  p->pObjs->Value = 0;
  pVVar9 = p->vCis;
  uVar11 = (ulong)(uint)pVVar9->nSize;
  if (0 < pVVar9->nSize) {
    lVar12 = 0;
    do {
      iVar5 = pVVar9->pArray[lVar12];
      if (((long)iVar5 < 0) || (p->nObjs <= iVar5)) goto LAB_006a52c1;
      pGVar3 = p->pObjs;
      if (pGVar3 == (Gia_Obj_t *)0x0) break;
      uVar10 = 0xffffffff;
      if ((int)uVar11 - nLastPis <= lVar12) {
        pGVar8 = Gia_ManAppendObj(p_00);
        uVar11 = *(ulong *)pGVar8;
        *(ulong *)pGVar8 = uVar11 | 0x9fffffff;
        *(ulong *)pGVar8 =
             uVar11 & 0xe0000000ffffffff | 0x9fffffff |
             (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
        pGVar4 = p_00->pObjs;
        if ((pGVar8 < pGVar4) || (pGVar4 + p_00->nObjs <= pGVar8)) {
LAB_006a52e0:
          __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                        ,0x1b7,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
        }
        Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar8 - (long)pGVar4) >> 2) * -0x55555555);
        pGVar4 = p_00->pObjs;
        if ((pGVar8 < pGVar4) || (pGVar4 + p_00->nObjs <= pGVar8)) goto LAB_006a52e0;
        uVar10 = (int)((ulong)((long)pGVar8 - (long)pGVar4) >> 2) * 0x55555556;
        pVVar9 = p->vCis;
      }
      pGVar3[iVar5].Value = uVar10;
      lVar12 = lVar12 + 1;
      uVar11 = (ulong)pVVar9->nSize;
    } while (lVar12 < (long)uVar11);
  }
  iVar5 = p->nObjs;
  if (0 < iVar5) {
    lVar13 = 8;
    lVar12 = 0;
    while (pGVar3 = p->pObjs, pGVar3 != (Gia_Obj_t *)0x0) {
      uVar11 = *(ulong *)((long)pGVar3 + lVar13 + -8);
      if ((uVar11 & 0x1fffffff) != 0x1fffffff && -1 < (int)uVar11) {
        uVar10 = *(uint *)((long)pGVar3 +
                          lVar13 + (ulong)(uint)((int)(uVar11 & 0x1fffffff) << 2) * -3);
        if (((int)uVar10 < 0) ||
           (uVar1 = *(uint *)((long)pGVar3 +
                             lVar13 + (ulong)((uint)(uVar11 >> 0x1e) & 0x7ffffffc) * -3),
           (int)uVar1 < 0)) goto LAB_006a52ff;
        iVar5 = Gia_ManAppendAnd(p_00,uVar10 ^ (uint)(uVar11 >> 0x1d) & 1,
                                 uVar1 ^ (uint)(uVar11 >> 0x3d) & 1);
        *(int *)(&pGVar3->field_0x0 + lVar13) = iVar5;
        iVar5 = p->nObjs;
      }
      lVar12 = lVar12 + 1;
      lVar13 = lVar13 + 0xc;
      if (iVar5 <= lVar12) break;
    }
  }
  pVVar9 = p->vCos;
  if (0 < pVVar9->nSize) {
    lVar12 = 0;
    do {
      iVar5 = pVVar9->pArray[lVar12];
      if (((long)iVar5 < 0) || (p->nObjs <= iVar5)) {
LAB_006a52c1:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                      ,0x1af,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (p->pObjs == (Gia_Obj_t *)0x0) {
        return p_00;
      }
      pGVar3 = p->pObjs + iVar5;
      if ((int)pGVar3[-(ulong)((uint)*(undefined8 *)pGVar3 & 0x1fffffff)].Value < 0) {
LAB_006a52ff:
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                      ,0xf5,"int Abc_LitNotCond(int, int)");
      }
      uVar10 = Gia_ManAppendCo(p_00,(uint)*(undefined8 *)pGVar3 >> 0x1d & 1 ^
                                    pGVar3[-(ulong)((uint)*(undefined8 *)pGVar3 & 0x1fffffff)].Value
                              );
      pGVar3->Value = uVar10;
      lVar12 = lVar12 + 1;
      pVVar9 = p->vCos;
    } while (lVar12 < pVVar9->nSize);
  }
  return p_00;
}

Assistant:

Gia_Man_t * Gia_ManDupLastPis( Gia_Man_t * p, int nLastPis )
{
    Gia_Man_t * pNew;
    Gia_Obj_t * pObj;
    int i;
    assert( Gia_ManRegNum(p) == 0 );
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManForEachCi( p, pObj, i )
        pObj->Value = (i < Gia_ManCiNum(p) - nLastPis) ? ~0 : Gia_ManAppendCi(pNew);
    Gia_ManForEachAnd( p, pObj, i )
        pObj->Value = Gia_ManAppendAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
    Gia_ManForEachCo( p, pObj, i )
        pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    return pNew;
}